

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunkset_avx2.c
# Opt level: O0

chunk_t_conflict1 * GET_CHUNK_MAG(uint8_t *buf,uint32_t *chunk_rem,uint32_t dist)

{
  lut_rem_pair lVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined8 uVar4;
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  longlong *plVar7;
  longlong *plVar8;
  chunk_t_conflict1 *palVar9;
  uint in_EDX;
  undefined1 in_SIL;
  undefined7 in_register_00000031;
  undefined1 in_DIL;
  undefined7 in_register_00000039;
  undefined1 auVar10 [16];
  __m128i latter_half;
  __m128i xlane_res;
  __m128i xlane_permutes;
  __m128i perm_vec1;
  __m128i ret_vec1;
  __m128i ret_vec0_1;
  __m128i ret_vec0;
  __m256i perm_vec;
  __m256i permute_xform;
  __m256i ret_vec;
  lut_rem_pair lut_rem;
  undefined8 uStack_270;
  undefined8 uStack_268;
  ushort local_248;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  
  palVar9 = (chunk_t_conflict1 *)CONCAT71(in_register_00000039,in_DIL);
  lVar1 = perm_idx_lut[in_EDX - 3];
  *(uint *)CONCAT71(in_register_00000031,in_SIL) = (uint)lVar1 >> 0x10;
  local_248 = lVar1.idx;
  if (in_EDX < 0x10) {
    auVar10 = vpinsrb_avx(ZEXT116(0),0,1);
    auVar10 = vpinsrb_avx(auVar10,0,2);
    auVar10 = vpinsrb_avx(auVar10,0,3);
    auVar10 = vpinsrb_avx(auVar10,0,4);
    auVar10 = vpinsrb_avx(auVar10,0,5);
    auVar10 = vpinsrb_avx(auVar10,0,6);
    auVar10 = vpinsrb_avx(auVar10,0,7);
    auVar10 = vpinsrb_avx(auVar10,0,8);
    auVar10 = vpinsrb_avx(auVar10,0,9);
    auVar10 = vpinsrb_avx(auVar10,0,10);
    auVar10 = vpinsrb_avx(auVar10,0,0xb);
    auVar10 = vpinsrb_avx(auVar10,0,0xc);
    auVar10 = vpinsrb_avx(auVar10,0,0xd);
    auVar10 = vpinsrb_avx(auVar10,0,0xe);
    auVar10 = vpinsrb_avx(auVar10,0,0xf);
    auVar2 = vpinsrb_avx(ZEXT116(0x10),0x10,1);
    auVar2 = vpinsrb_avx(auVar2,0x10,2);
    auVar2 = vpinsrb_avx(auVar2,0x10,3);
    auVar2 = vpinsrb_avx(auVar2,0x10,4);
    auVar2 = vpinsrb_avx(auVar2,0x10,5);
    auVar2 = vpinsrb_avx(auVar2,0x10,6);
    auVar2 = vpinsrb_avx(auVar2,0x10,7);
    auVar2 = vpinsrb_avx(auVar2,0x10,8);
    auVar2 = vpinsrb_avx(auVar2,0x10,9);
    auVar2 = vpinsrb_avx(auVar2,0x10,10);
    auVar2 = vpinsrb_avx(auVar2,0x10,0xb);
    auVar2 = vpinsrb_avx(auVar2,0x10,0xc);
    auVar2 = vpinsrb_avx(auVar2,0x10,0xd);
    auVar2 = vpinsrb_avx(auVar2,0x10,0xe);
    auVar2 = vpinsrb_avx(auVar2,0x10,0xf);
    uStack_b0 = auVar2._0_8_;
    uStack_a8 = auVar2._8_8_;
    uVar4 = *(undefined8 *)("" + local_248);
    auVar5._8_8_ = uVar4;
    auVar5._0_8_ = uVar4;
    auVar5._16_8_ = uVar4;
    auVar5._24_8_ = uVar4;
    auVar3._16_8_ = uStack_b0;
    auVar3._0_16_ = auVar10;
    auVar3._24_8_ = uStack_a8;
    auVar3 = vpaddb_avx2(auVar5,auVar3);
    auVar10 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) +
              ZEXT116(1) * *(undefined1 (*) [16])*palVar9;
    uStack_270 = auVar10._0_8_;
    uStack_268 = auVar10._8_8_;
    auVar6._16_8_ = uStack_270;
    auVar6._0_16_ =
         ZEXT116(0) * *(undefined1 (*) [16])*palVar9 + ZEXT116(1) * *(undefined1 (*) [16])*palVar9;
    auVar6._24_8_ = uStack_268;
    vpshufb_avx2(auVar6,auVar3);
  }
  else {
    plVar7 = *palVar9;
    plVar8 = *palVar9;
    auVar10 = vpinsrb_avx(ZEXT116(0x10),0x10,1);
    auVar10 = vpinsrb_avx(auVar10,0x10,2);
    auVar10 = vpinsrb_avx(auVar10,0x10,3);
    auVar10 = vpinsrb_avx(auVar10,0x10,4);
    auVar10 = vpinsrb_avx(auVar10,0x10,5);
    auVar10 = vpinsrb_avx(auVar10,0x10,6);
    auVar10 = vpinsrb_avx(auVar10,0x10,7);
    auVar10 = vpinsrb_avx(auVar10,0x10,8);
    auVar10 = vpinsrb_avx(auVar10,0x10,9);
    auVar10 = vpinsrb_avx(auVar10,0x10,10);
    auVar10 = vpinsrb_avx(auVar10,0x10,0xb);
    auVar10 = vpinsrb_avx(auVar10,0x10,0xc);
    auVar10 = vpinsrb_avx(auVar10,0x10,0xd);
    auVar10 = vpinsrb_avx(auVar10,0x10,0xe);
    palVar9 = (chunk_t_conflict1 *)0x10;
    auVar10 = vpinsrb_avx(auVar10,0x10,0xf);
    auVar10 = vpcmpgtb_avx(auVar10,*(undefined1 (*) [16])("" + local_248));
    auVar2 = vpshufb_avx(*(undefined1 (*) [16])plVar7,*(undefined1 (*) [16])("" + local_248));
    vpblendvb_avx(*(undefined1 (*) [16])(plVar8 + 2),auVar2,auVar10);
  }
  return palVar9;
}

Assistant:

static inline chunk_t GET_CHUNK_MAG(uint8_t *buf, uint32_t *chunk_rem, uint32_t dist) {
    lut_rem_pair lut_rem = perm_idx_lut[dist - 3];
    __m256i ret_vec;
    /* While technically we only need to read 4 or 8 bytes into this vector register for a lot of cases, GCC is
     * compiling this to a shared load for all branches, preferring the simpler code.  Given that the buf value isn't in
     * GPRs to begin with the 256 bit load is _probably_ just as inexpensive */
    *chunk_rem = lut_rem.remval;

    /* See note in chunkset_ssse3.c for why this is ok */
    __msan_unpoison(buf + dist, 32 - dist);

    if (dist < 16) {
        /* This simpler case still requires us to shuffle in 128 bit lanes, so we must apply a static offset after
         * broadcasting the first vector register to both halves. This is _marginally_ faster than doing two separate
         * shuffles and combining the halves later */
        const __m256i permute_xform =
            _mm256_setr_epi8(0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
                             16, 16, 16, 16, 16, 16, 16, 16, 16, 16, 16, 16, 16, 16, 16, 16);
        __m256i perm_vec = _mm256_load_si256((__m256i*)(permute_table+lut_rem.idx));
        __m128i ret_vec0 = _mm_loadu_si128((__m128i*)buf);
        perm_vec = _mm256_add_epi8(perm_vec, permute_xform);
        ret_vec = _mm256_inserti128_si256(_mm256_castsi128_si256(ret_vec0), ret_vec0, 1);
        ret_vec = _mm256_shuffle_epi8(ret_vec, perm_vec);
    }  else {
        __m128i ret_vec0 = _mm_loadu_si128((__m128i*)buf);
        __m128i ret_vec1 = _mm_loadu_si128((__m128i*)(buf + 16));
        /* Take advantage of the fact that only the latter half of the 256 bit vector will actually differ */
        __m128i perm_vec1 = _mm_load_si128((__m128i*)(permute_table + lut_rem.idx));
        __m128i xlane_permutes = _mm_cmpgt_epi8(_mm_set1_epi8(16), perm_vec1);
        __m128i xlane_res  = _mm_shuffle_epi8(ret_vec0, perm_vec1);
        /* Since we can't wrap twice, we can simply keep the later half exactly how it is instead of having to _also_
         * shuffle those values */
        __m128i latter_half = _mm_blendv_epi8(ret_vec1, xlane_res, xlane_permutes);
        ret_vec = _mm256_inserti128_si256(_mm256_castsi128_si256(ret_vec0), latter_half, 1);
    }

    return ret_vec;
}